

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Base.cpp
# Opt level: O0

string * __thiscall
adios2::format::BP4Base::GetBPSubStreamName
          (BP4Base *this,string *name,size_t id,bool hasSubFiles,bool isReader)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RDX;
  long *in_RSI;
  string *in_RDI;
  uint in_R8D;
  byte in_R9B;
  size_t index;
  string bpName;
  string *bpRankName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  string *__lhs;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [39];
  undefined1 local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  string local_48 [38];
  byte local_22;
  byte local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  local_21 = (byte)in_R8D & 1;
  local_22 = in_R9B & 1;
  if ((in_R8D & 1) == 0) {
    std::__cxx11::string::string((string *)in_RDI,in_RDX);
    __lhs = in_RDI;
  }
  else {
    __lhs = in_RDI;
    local_20 = in_RCX;
    helper::RemoveTrailingSlash(in_stack_ffffffffffffff08);
    if (((local_22 & 1) == 0) &&
       (in_stack_ffffffffffffff00 = local_20,
       (*(byte *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x329) & 1) != 0)) {
      in_stack_ffffffffffffff00 =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x308);
      local_20 = in_stack_ffffffffffffff00;
    }
    local_51 = 0;
    local_50 = local_20;
    std::operator+(in_RCX,(char)(in_R8D >> 0x18));
    std::operator+(local_20,(char *)in_stack_ffffffffffffff00);
    std::__cxx11::to_string((unsigned_long)__lhs);
    std::operator+(__lhs,in_RDI);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
    local_51 = 1;
    std::__cxx11::string::~string(local_48);
  }
  return __lhs;
}

Assistant:

std::string BP4Base::GetBPSubStreamName(const std::string &name, const size_t id,
                                        const bool hasSubFiles, const bool isReader) const noexcept
{
    if (!hasSubFiles)
    {
        return name;
    }

    const std::string bpName = helper::RemoveTrailingSlash(name);

    const size_t index = isReader                  ? id
                         : m_Aggregator.m_IsActive ? m_Aggregator.m_SubStreamIndex
                                                   : id;

    /* the name of a data file starts with "data." */
    const std::string bpRankName(bpName + PathSeparator + "data." + std::to_string(index));
    return bpRankName;
}